

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeGeneric::Build_CqT
          (ChConstraintThreeGeneric *this,ChSparseMatrix *storage,int inscol)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    pdVar2 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) goto LAB_007f5d77;
    if (0 < lVar3) {
      iVar1 = ((this->super_ChConstraintThree).variables_a)->offset;
      lVar4 = 0;
      do {
        if (lVar3 <= lVar4) goto LAB_007f5d58;
        (**storage->_vptr_SparseMatrix)
                  (pdVar2[lVar4],storage,(ulong)(uint)(iVar1 + (int)lVar4),(ulong)(uint)inscol,1);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    pdVar2 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar3 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) goto LAB_007f5d77;
    if (0 < lVar3) {
      iVar1 = ((this->super_ChConstraintThree).variables_b)->offset;
      lVar4 = 0;
      do {
        if (lVar3 <= lVar4) goto LAB_007f5d58;
        (**storage->_vptr_SparseMatrix)
                  (pdVar2[lVar4],storage,(ulong)(uint)(iVar1 + (int)lVar4),(ulong)(uint)inscol,1);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  if (((this->super_ChConstraintThree).variables_c)->disabled == false) {
    pdVar2 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar3 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) {
LAB_007f5d77:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                   );
    }
    if (0 < lVar3) {
      iVar1 = ((this->super_ChConstraintThree).variables_c)->offset;
      lVar4 = 0;
      do {
        if (lVar3 <= lVar4) {
LAB_007f5d58:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        (**storage->_vptr_SparseMatrix)
                  (pdVar2[lVar4],storage,(ulong)(uint)(iVar1 + (int)lVar4),(ulong)(uint)inscol,1);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::Build_CqT(ChSparseMatrix& storage, int inscol) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a.transpose(), variables_a->GetOffset(), inscol);
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b.transpose(), variables_b->GetOffset(), inscol);
    if (variables_c->IsActive())
        PasteMatrix(storage, Cq_c.transpose(), variables_c->GetOffset(), inscol);
}